

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::PixelBufferAccess::setPixel(PixelBufferAccess *this,Vec4 *color,int x,int y,int z)

{
  ChannelType type;
  uint uVar1;
  uint uVar2;
  deUint32 dVar3;
  Float<unsigned_int,_5,_6,_15,_2U> FVar4;
  Float<unsigned_int,_5,_6,_15,_2U> FVar5;
  Float<unsigned_int,_5,_5,_15,_2U> FVar6;
  TextureSwizzle *pTVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  ushort uVar11;
  int iVar12;
  long lVar13;
  deUint32 *dst;
  ulong uVar14;
  ChannelOrder order;
  ushort uVar15;
  bool bVar16;
  deUint32 u32;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float q;
  float fVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  Float<unsigned_int,_8,_23,_127,_3U> local_3c;
  Float<unsigned_int,_8,_23,_127,_3U> local_38;
  Float<unsigned_int,_8,_23,_127,_3U> local_34;
  
  dst = (deUint32 *)
        ((long)(this->super_ConstPixelBufferAccess).m_data +
        (long)(z * (this->super_ConstPixelBufferAccess).m_pitch.m_data[2]) +
        (long)(y * (this->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
        (long)(x * (this->super_ConstPixelBufferAccess).m_pitch.m_data[0]));
  type = (this->super_ConstPixelBufferAccess).m_format.type;
  switch(type) {
  case UNORM_INT8:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
    switch(order) {
    case RGB:
    case sRGB:
      uVar2 = 0x7e - ((int)color->m_data[0] >> 0x17);
      uVar1 = (((uint)color->m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)dst = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[1] >> 0x17);
      uVar1 = (((uint)color->m_data[1] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 1) = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[2] >> 0x17);
      uVar1 = (((uint)color->m_data[2] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 2) = (char)(uVar1 >> 0x18);
      break;
    case RGBA:
    case sRGBA:
      uVar2 = 0x7e - ((int)color->m_data[0] >> 0x17);
      uVar1 = (((uint)color->m_data[0] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)dst = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[1] >> 0x17);
      uVar1 = (((uint)color->m_data[1] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 1) = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[2] >> 0x17);
      uVar1 = (((uint)color->m_data[2] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 2) = (char)(uVar1 >> 0x18);
      uVar2 = 0x7e - ((int)color->m_data[3] >> 0x17);
      uVar1 = (((uint)color->m_data[3] & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) +
              0x800000;
      if (8 < uVar2) {
        uVar1 = uVar2;
      }
      *(char *)((long)dst + 3) = (char)(uVar1 >> 0x18);
      break;
    default:
      goto switchD_001542ea_caseD_9;
    }
    break;
  default:
    order = (this->super_ConstPixelBufferAccess).m_format.order;
switchD_001542ea_caseD_9:
    uVar1 = getNumUsedChannels(order);
    pTVar7 = getChannelWriteSwizzle(order);
    if (uVar1 != 0) {
      uVar2 = getChannelSize(type);
      uVar14 = 0;
      do {
        anon_unknown_74::floatToChannel
                  ((deUint8 *)dst,color->m_data[(int)pTVar7->components[uVar14]],
                   (this->super_ConstPixelBufferAccess).m_format.type);
        uVar14 = uVar14 + 1;
        dst = (deUint32 *)((long)dst + (ulong)uVar2);
      } while (uVar1 != uVar14);
    }
    break;
  case UNORM_BYTE_44:
    fVar18 = color->m_data[0] * 15.0;
    fVar20 = floorf(fVar18);
    fVar20 = fVar18 - fVar20;
    lVar8 = (long)(fVar18 - fVar20);
    if ((fVar20 != 0.5) || (NAN(fVar20))) {
      if (0.5 < fVar20) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0xf;
    if (uVar1 < 0xf) {
      uVar2 = uVar1;
    }
    fVar18 = color->m_data[1] * 15.0;
    fVar20 = floorf(fVar18);
    fVar20 = fVar18 - fVar20;
    lVar8 = (long)(fVar18 - fVar20);
    if ((fVar20 != 0.5) || (NAN(fVar20))) {
      if (0.5 < fVar20) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar22 = 0xf;
    if (uVar1 < 0xf) {
      uVar22 = uVar1;
    }
    bVar10 = (byte)uVar22 | (byte)(uVar2 << 4);
    goto LAB_00154e5c;
  case UNORM_SHORT_565:
    bVar16 = (this->super_ConstPixelBufferAccess).m_format.order == RGB;
    fVar20 = color->m_data[(ulong)bVar16 * 2];
    fVar18 = color->m_data[1];
    fVar19 = color->m_data[(ulong)!bVar16 * 2] * 31.0;
    fVar17 = floorf(fVar19);
    fVar17 = fVar19 - fVar17;
    lVar8 = (long)(fVar19 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    uVar15 = (ushort)(uVar2 << 0xb);
    fVar18 = fVar18 * 63.0;
    fVar19 = floorf(fVar18);
    fVar19 = fVar18 - fVar19;
    lVar8 = (long)(fVar18 - fVar19);
    if ((fVar19 != 0.5) || (NAN(fVar19))) {
      if (0.5 < fVar19) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    bVar16 = uVar1 < 0x3f;
    uVar2 = 0x3f;
    goto LAB_001550da;
  case UNORM_SHORT_555:
    bVar16 = (this->super_ConstPixelBufferAccess).m_format.order == RGB;
    fVar18 = color->m_data[1];
    fVar20 = color->m_data[(ulong)bVar16 * 2];
    fVar17 = color->m_data[(ulong)!bVar16 * 2] * 31.0;
    fVar19 = floorf(fVar17);
    fVar19 = fVar17 - fVar19;
    lVar8 = (long)(fVar17 - fVar19);
    if ((fVar19 != 0.5) || (NAN(fVar19))) {
      if (0.5 < fVar19) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    uVar15 = (ushort)(uVar2 << 10);
    fVar18 = fVar18 * 31.0;
    fVar19 = floorf(fVar18);
    fVar19 = fVar18 - fVar19;
    lVar8 = (long)(fVar18 - fVar19);
    if ((fVar19 != 0.5) || (NAN(fVar19))) {
      if (0.5 < fVar19) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    bVar16 = uVar1 < 0x1f;
    uVar2 = 0x1f;
LAB_001550da:
    if (bVar16) {
      uVar2 = uVar1;
    }
    uVar15 = (ushort)(uVar2 << 5) | uVar15;
    fVar20 = fVar20 * 31.0;
    fVar18 = floorf(fVar20);
    fVar18 = fVar20 - fVar18;
    lVar8 = (long)(fVar20 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    bVar16 = uVar1 < 0x1f;
    uVar11 = 0x1f;
LAB_0015514b:
    if (bVar16) {
      uVar11 = (ushort)uVar1;
    }
    uVar11 = uVar11 | uVar15;
LAB_001552b3:
    *(ushort *)dst = uVar11;
    break;
  case UNORM_SHORT_4444:
    bVar16 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar18 = color->m_data[1];
    fVar20 = color->m_data[3];
    fVar19 = color->m_data[(ulong)bVar16 * 2];
    fVar21 = color->m_data[(ulong)!bVar16 * 2] * 15.0;
    fVar17 = floorf(fVar21);
    fVar17 = fVar21 - fVar17;
    lVar8 = (long)(fVar21 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0xf;
    if (uVar1 < 0xf) {
      uVar2 = uVar1;
    }
    fVar18 = fVar18 * 15.0;
    fVar17 = floorf(fVar18);
    fVar17 = fVar18 - fVar17;
    lVar8 = (long)(fVar18 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar22 = 0xf;
    if (uVar1 < 0xf) {
      uVar22 = uVar1;
    }
    fVar19 = fVar19 * 15.0;
    fVar18 = floorf(fVar19);
    fVar18 = fVar19 - fVar18;
    lVar8 = (long)(fVar19 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar23 = 0xf;
    if (uVar1 < 0xf) {
      uVar23 = uVar1;
    }
    uVar15 = (ushort)(uVar23 << 4) | (ushort)(uVar22 << 8) | (ushort)(uVar2 << 0xc);
    fVar20 = fVar20 * 15.0;
    fVar18 = floorf(fVar20);
    fVar18 = fVar20 - fVar18;
    lVar8 = (long)(fVar20 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    bVar16 = uVar1 < 0xf;
    uVar11 = 0xf;
    goto LAB_0015514b;
  case UNORM_SHORT_5551:
    bVar16 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar18 = color->m_data[1];
    fVar20 = color->m_data[3];
    fVar19 = color->m_data[(ulong)bVar16 * 2];
    fVar21 = color->m_data[(ulong)!bVar16 * 2] * 31.0;
    fVar17 = floorf(fVar21);
    fVar17 = fVar21 - fVar17;
    lVar8 = (long)(fVar21 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    fVar18 = fVar18 * 31.0;
    fVar17 = floorf(fVar18);
    fVar17 = fVar18 - fVar17;
    lVar8 = (long)(fVar18 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar22 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar22 = uVar1;
    }
    fVar19 = fVar19 * 31.0;
    fVar18 = floorf(fVar19);
    fVar18 = fVar19 - fVar18;
    lVar8 = (long)(fVar19 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar23 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar23 = uVar1;
    }
    fVar18 = floorf(fVar20);
    fVar18 = fVar20 - fVar18;
    lVar8 = (long)(fVar20 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    *(ushort *)dst =
         ((ushort)(uVar22 << 6) | (ushort)(uVar2 << 0xb)) + (short)uVar23 * 2 | (ushort)(0 < lVar8);
    break;
  case UNORM_SHORT_1555:
    fVar18 = color->m_data[3];
    fVar20 = color->m_data[0];
    fVar19 = color->m_data[1];
    fVar17 = color->m_data[2];
    fVar21 = floorf(fVar18);
    fVar21 = fVar18 - fVar21;
    lVar8 = (long)(fVar18 - fVar21);
    if ((fVar21 != 0.5) || (NAN(fVar21))) {
      if (0.5 < fVar21) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    fVar20 = fVar20 * 31.0;
    fVar18 = floorf(fVar20);
    fVar18 = fVar20 - fVar18;
    lVar9 = (long)(fVar20 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar9 = lVar9 + 1;
      }
    }
    else {
      lVar9 = lVar9 + (ulong)((uint)lVar9 & 1);
    }
    lVar13 = 0xffffffff;
    if (lVar9 < 0xffffffff) {
      lVar13 = lVar9;
    }
    uVar1 = 0;
    if (0 < lVar13) {
      uVar1 = (uint)lVar13;
    }
    uVar2 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar2 = uVar1;
    }
    fVar19 = fVar19 * 31.0;
    fVar18 = floorf(fVar19);
    fVar18 = fVar19 - fVar18;
    lVar9 = (long)(fVar19 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar9 = lVar9 + 1;
      }
    }
    else {
      lVar9 = lVar9 + (ulong)((uint)lVar9 & 1);
    }
    lVar13 = 0xffffffff;
    if (lVar9 < 0xffffffff) {
      lVar13 = lVar9;
    }
    uVar1 = 0;
    if (0 < lVar13) {
      uVar1 = (uint)lVar13;
    }
    uVar22 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar22 = uVar1;
    }
    fVar17 = fVar17 * 31.0;
    fVar18 = floorf(fVar17);
    fVar18 = fVar17 - fVar18;
    lVar9 = (long)(fVar17 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar9 = lVar9 + 1;
      }
    }
    else {
      lVar9 = lVar9 + (ulong)((uint)lVar9 & 1);
    }
    lVar13 = 0xffffffff;
    if (lVar9 < 0xffffffff) {
      lVar13 = lVar9;
    }
    uVar1 = 0;
    if (0 < lVar13) {
      uVar1 = (uint)lVar13;
    }
    uVar23 = 0x1f;
    if (uVar1 < 0x1f) {
      uVar23 = uVar1;
    }
    uVar11 = (ushort)uVar23 |
             (ushort)(uVar22 << 5) | (ushort)(uVar2 << 10) | (ushort)(0 < lVar8) << 0xf;
    goto LAB_001552b3;
  case UNORM_INT_101010:
    fVar18 = color->m_data[0] * 1023.0;
    fVar20 = floorf(fVar18);
    fVar20 = fVar18 - fVar20;
    lVar8 = (long)(fVar18 - fVar20);
    if ((fVar20 != 0.5) || (NAN(fVar20))) {
      if (0.5 < fVar20) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar2 = uVar1;
    }
    fVar18 = color->m_data[1] * 1023.0;
    fVar20 = floorf(fVar18);
    fVar20 = fVar18 - fVar20;
    lVar8 = (long)(fVar18 - fVar20);
    if ((fVar20 != 0.5) || (NAN(fVar20))) {
      if (0.5 < fVar20) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar22 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar22 = uVar1;
    }
    fVar18 = color->m_data[2] * 1023.0;
    fVar20 = floorf(fVar18);
    fVar20 = fVar18 - fVar20;
    lVar8 = (long)(fVar18 - fVar20);
    if ((fVar20 != 0.5) || (NAN(fVar20))) {
      if (0.5 < fVar20) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar23 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar23 = uVar1;
    }
    dVar3 = (uVar22 << 0xc | uVar2 << 0x16) + uVar23 * 4;
    goto LAB_001553c0;
  case SNORM_INT_1010102_REV:
    bVar16 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar18 = color->m_data[1];
    fVar20 = color->m_data[3];
    fVar19 = color->m_data[(ulong)bVar16 * 2];
    fVar21 = color->m_data[(ulong)!bVar16 * 2] * 511.0;
    fVar17 = floorf(fVar21);
    fVar17 = fVar21 - fVar17;
    lVar8 = (long)(fVar21 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    lVar13 = -0x80000000;
    if (-0x80000000 < lVar9) {
      lVar13 = lVar9;
    }
    uVar1 = 0x1ff;
    if ((int)(uint)lVar13 < 0x1ff) {
      uVar1 = (uint)lVar13;
    }
    uVar2 = 0x201;
    if (-0x200 < lVar8) {
      uVar2 = uVar1 & 0x3ff;
    }
    fVar18 = fVar18 * 511.0;
    fVar17 = floorf(fVar18);
    fVar17 = fVar18 - fVar17;
    lVar8 = (long)(fVar18 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    lVar13 = -0x80000000;
    if (-0x80000000 < lVar9) {
      lVar13 = lVar9;
    }
    uVar1 = 0x1ff;
    if ((int)(uint)lVar13 < 0x1ff) {
      uVar1 = (uint)lVar13;
    }
    uVar22 = 0x80400;
    if (-0x200 < lVar8) {
      uVar22 = (uVar1 & 0x3ff) << 10;
    }
    fVar19 = fVar19 * 511.0;
    fVar18 = floorf(fVar19);
    fVar18 = fVar19 - fVar18;
    lVar8 = (long)(fVar19 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    lVar13 = -0x80000000;
    if (-0x80000000 < lVar9) {
      lVar13 = lVar9;
    }
    uVar1 = 0x1ff;
    if ((int)(uint)lVar13 < 0x1ff) {
      uVar1 = (uint)lVar13;
    }
    uVar23 = 0x20100000;
    if (-0x200 < lVar8) {
      uVar23 = (uVar1 & 0x3ff) << 0x14;
    }
    fVar18 = floorf(fVar20);
    fVar18 = fVar20 - fVar18;
    lVar8 = (long)(fVar20 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0x7fffffff;
    if (lVar8 < 0x7fffffff) {
      lVar9 = lVar8;
    }
    iVar24 = -0x80000000;
    if (-0x80000000 < lVar9) {
      iVar24 = (int)lVar9;
    }
    iVar12 = 1;
    if (iVar24 < 1) {
      iVar12 = iVar24;
    }
    uVar1 = 0xc0000000;
    if (-2 < lVar8) {
      uVar1 = iVar12 << 0x1e;
    }
    *dst = uVar22 | uVar2 | uVar23 | uVar1;
    break;
  case UNORM_INT_1010102_REV:
    bVar16 = (this->super_ConstPixelBufferAccess).m_format.order == RGBA;
    fVar18 = color->m_data[1];
    fVar20 = color->m_data[3];
    fVar19 = color->m_data[(ulong)bVar16 * 2];
    fVar21 = color->m_data[(ulong)!bVar16 * 2] * 1023.0;
    fVar17 = floorf(fVar21);
    fVar17 = fVar21 - fVar17;
    lVar8 = (long)(fVar21 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar2 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar2 = uVar1;
    }
    fVar18 = fVar18 * 1023.0;
    fVar17 = floorf(fVar18);
    fVar17 = fVar18 - fVar17;
    lVar8 = (long)(fVar18 - fVar17);
    if ((fVar17 != 0.5) || (NAN(fVar17))) {
      if (0.5 < fVar17) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar22 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar22 = uVar1;
    }
    fVar19 = fVar19 * 1023.0;
    fVar18 = floorf(fVar19);
    fVar18 = fVar19 - fVar18;
    lVar8 = (long)(fVar19 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar23 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar23 = uVar1;
    }
    fVar20 = fVar20 * 3.0;
    fVar18 = floorf(fVar20);
    fVar18 = fVar20 - fVar18;
    lVar8 = (long)(fVar20 - fVar18);
    if ((fVar18 != 0.5) || (NAN(fVar18))) {
      if (0.5 < fVar18) {
        lVar8 = lVar8 + 1;
      }
    }
    else {
      lVar8 = lVar8 + (ulong)((uint)lVar8 & 1);
    }
    lVar9 = 0xffffffff;
    if (lVar8 < 0xffffffff) {
      lVar9 = lVar8;
    }
    uVar1 = 0;
    if (0 < lVar9) {
      uVar1 = (uint)lVar9;
    }
    uVar25 = 3;
    if (uVar1 < 3) {
      uVar25 = uVar1;
    }
    dVar3 = uVar25 << 0x1e | uVar23 << 0x14 | uVar22 << 10 | uVar2;
    goto LAB_0015553d;
  case UNSIGNED_BYTE_44:
    uVar1 = (uint)(long)color->m_data[0];
    if (0xe < uVar1) {
      uVar1 = 0xf;
    }
    uVar22 = (uint)(long)color->m_data[1];
    uVar2 = 0xf;
    if (uVar22 < 0xf) {
      uVar2 = uVar22;
    }
    bVar10 = (byte)uVar2 | (byte)(uVar1 << 4);
LAB_00154e5c:
    *(byte *)dst = bVar10;
    break;
  case UNSIGNED_SHORT_565:
    uVar2 = (uint)color->m_data[0];
    uVar22 = (uint)color->m_data[1];
    uVar23 = (uint)color->m_data[2];
    uVar2 = (int)(color->m_data[0] - 2.1474836e+09) & (int)uVar2 >> 0x1f | uVar2;
    uVar22 = (int)(color->m_data[1] - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
    uVar23 = (int)(color->m_data[2] - 2.1474836e+09) & (int)uVar23 >> 0x1f | uVar23;
    uVar1 = uVar23;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGB) {
      uVar1 = uVar2;
      uVar2 = uVar23;
    }
    if (0x1e < uVar1) {
      uVar1 = 0x1f;
    }
    uVar23 = 0x3f;
    if (uVar22 < 0x3f) {
      uVar23 = uVar22;
    }
    uVar22 = 0x1f;
    if (uVar2 < 0x1f) {
      uVar22 = uVar2;
    }
    *(ushort *)dst = (ushort)uVar22 | (ushort)(uVar23 << 5) | (ushort)(uVar1 << 0xb);
    break;
  case UNSIGNED_SHORT_4444:
    uVar2 = (uint)color->m_data[0];
    uVar22 = (uint)color->m_data[1];
    uVar23 = (uint)color->m_data[2];
    uVar25 = (uint)color->m_data[3];
    uVar2 = (int)(color->m_data[0] - 2.1474836e+09) & (int)uVar2 >> 0x1f | uVar2;
    uVar22 = (int)(color->m_data[1] - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
    uVar23 = (int)(color->m_data[2] - 2.1474836e+09) & (int)uVar23 >> 0x1f | uVar23;
    uVar25 = (int)(color->m_data[3] - 2.1474836e+09) & (int)uVar25 >> 0x1f | uVar25;
    uVar1 = uVar23;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      uVar1 = uVar2;
      uVar2 = uVar23;
    }
    if (0xe < uVar1) {
      uVar1 = 0xf;
    }
    if (0xe < uVar22) {
      uVar22 = 0xf;
    }
    if (0xe < uVar2) {
      uVar2 = 0xf;
    }
    uVar23 = 0xf;
    if (uVar25 < 0xf) {
      uVar23 = uVar25;
    }
    *(ushort *)dst =
         (ushort)uVar23 | (ushort)(uVar2 << 4) | (ushort)(uVar22 << 8) | (ushort)(uVar1 << 0xc);
    break;
  case UNSIGNED_SHORT_5551:
    uVar2 = (uint)color->m_data[0];
    uVar22 = (uint)color->m_data[1];
    uVar23 = (uint)color->m_data[2];
    iVar24 = (int)color->m_data[3];
    uVar2 = (int)(color->m_data[0] - 2.1474836e+09) & (int)uVar2 >> 0x1f | uVar2;
    uVar22 = (int)(color->m_data[1] - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
    uVar23 = (int)(color->m_data[2] - 2.1474836e+09) & (int)uVar23 >> 0x1f | uVar23;
    uVar1 = uVar23;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      uVar1 = uVar2;
      uVar2 = uVar23;
    }
    if (0x1e < uVar1) {
      uVar1 = 0x1f;
    }
    if (0x1e < uVar22) {
      uVar22 = 0x1f;
    }
    uVar23 = 0x1f;
    if (uVar2 < 0x1f) {
      uVar23 = uVar2;
    }
    *(ushort *)dst =
         (ushort)(((int)(color->m_data[3] - 2.1474836e+09) & iVar24 >> 0x1f) != 0 || iVar24 != 0) |
         ((ushort)(uVar22 << 6) | (ushort)(uVar1 << 0xb)) + (short)uVar23 * 2;
    break;
  case SIGNED_INT_1010102_REV:
    uVar2 = (uint)color->m_data[0];
    uVar22 = (uint)color->m_data[1];
    uVar1 = (int)color->m_data[2];
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      uVar1 = uVar2;
      uVar2 = (int)color->m_data[2];
    }
    if (0x1fe < (int)uVar1) {
      uVar1 = 0x1ff;
    }
    if ((int)uVar1 < -0x1ff) {
      uVar1 = 0xfffffe00;
    }
    if (0x1fe < (int)uVar22) {
      uVar22 = 0x1ff;
    }
    if ((int)uVar22 < -0x1ff) {
      uVar22 = 0xfffffe00;
    }
    uVar23 = 0x1ff;
    if ((int)uVar2 < 0x1ff) {
      uVar23 = uVar2;
    }
    if ((int)uVar23 < -0x1ff) {
      uVar23 = 0xfffffe00;
    }
    iVar24 = 1;
    if ((int)color->m_data[3] < 1) {
      iVar24 = (int)color->m_data[3];
    }
    iVar12 = -2;
    if (-2 < iVar24) {
      iVar12 = iVar24;
    }
    dVar3 = iVar12 << 0x1e | (uVar23 & 0x3ff) << 0x14 | (uVar22 & 0x3ff) << 10 | uVar1 & 0x3ff;
    goto LAB_0015553d;
  case UNSIGNED_INT_1010102_REV:
    uVar2 = (uint)color->m_data[0];
    uVar22 = (uint)color->m_data[1];
    uVar23 = (uint)color->m_data[2];
    uVar25 = (uint)color->m_data[3];
    uVar2 = (int)(color->m_data[0] - 2.1474836e+09) & (int)uVar2 >> 0x1f | uVar2;
    uVar22 = (int)(color->m_data[1] - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
    uVar23 = (int)(color->m_data[2] - 2.1474836e+09) & (int)uVar23 >> 0x1f | uVar23;
    uVar25 = (int)(color->m_data[3] - 2.1474836e+09) & (int)uVar25 >> 0x1f | uVar25;
    uVar1 = uVar23;
    if ((this->super_ConstPixelBufferAccess).m_format.order == RGBA) {
      uVar1 = uVar2;
      uVar2 = uVar23;
    }
    if (0x3fe < uVar1) {
      uVar1 = 0x3ff;
    }
    if (0x3fe < uVar22) {
      uVar22 = 0x3ff;
    }
    uVar23 = 0x3ff;
    if (uVar2 < 0x3ff) {
      uVar23 = uVar2;
    }
    uVar2 = 3;
    if (uVar25 < 3) {
      uVar2 = uVar25;
    }
    dVar3 = uVar2 << 0x1e | uVar23 << 0x14 | uVar1 | uVar22 << 10;
LAB_0015553d:
    *dst = dVar3;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    local_3c.m_value = (StorageType)color->m_data[0];
    FVar4 = Float<unsigned_int,5,6,15,2u>::convert<unsigned_int,8,23,127,3u>(&local_3c);
    local_38.m_value = (StorageType)color->m_data[1];
    FVar5 = Float<unsigned_int,5,6,15,2u>::convert<unsigned_int,8,23,127,3u>(&local_38);
    local_34.m_value = (StorageType)color->m_data[2];
    FVar6 = Float<unsigned_int,5,5,15,2u>::convert<unsigned_int,8,23,127,3u>(&local_34);
    dVar3 = FVar6.m_value << 0x16 | FVar5.m_value << 0xb | FVar4.m_value;
    goto LAB_001553c0;
  case UNSIGNED_INT_999_E5_REV:
    dVar3 = packRGB999E5(color);
LAB_001553c0:
    *dst = dVar3;
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixel (const Vec4& color, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
		{
			writeRGBA8888Float(pixelPtr, color);
			return;
		}
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
		{
			writeRGB888Float(pixelPtr, color);
			return;
		}
	}

#define PN(VAL, OFFS, BITS)		(unormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PS(VAL, OFFS, BITS)		(snormFloatToChannel((VAL), (BITS)) << (OFFS))
#define PU(VAL, OFFS, BITS)		(uintToChannel((VAL), (BITS)) << (OFFS))
#define PI(VAL, OFFS, BITS)		(intToChannel((VAL), (BITS)) << (OFFS))

	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:		*((deUint8 *)pixelPtr) = (deUint8)(PN(color[0], 4, 4) | PN(color[1], 0, 4));						break;
		case TextureFormat::UNSIGNED_BYTE_44:	*((deUint8 *)pixelPtr) = (deUint8)(PU((deUint32)color[0], 4, 4) | PU((deUint32)color[1], 0, 4));	break;
		case TextureFormat::UNORM_INT_101010:	*((deUint32*)pixelPtr) = PN(color[0], 22, 10) | PN(color[1], 12, 10) | PN(color[2], 2, 10);			break;

		case TextureFormat::UNORM_SHORT_565:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 5, 6) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_565:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 5, 6) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_555:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 10, 5) | PN(swizzled[1], 5, 5) | PN(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_4444:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 12, 4) | PN(swizzled[1], 8, 4) | PN(swizzled[2], 4, 4) | PN(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_4444:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 12, 4) | PU(swizzled[1], 8, 4) | PU(swizzled[2], 4, 4) | PU(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNORM_SHORT_5551:
		{
			const Vec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 11, 5) | PN(swizzled[1], 6, 5) | PN(swizzled[2], 1, 5) | PN(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_SHORT_1555:
		{
			const Vec4 swizzled = color.swizzle(3,0,1,2); // RGBA -> ARGB
			*((deUint16*)pixelPtr) = (deUint16)(PN(swizzled[0], 15, 1) | PN(swizzled[1], 10, 5) | PN(swizzled[2], 5, 5) | PN(swizzled[3], 0, 5));
			break;
		}

		case TextureFormat::UNSIGNED_SHORT_5551:
		{
			const UVec4 swizzled = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 6, 5) | PU(swizzled[2], 1, 5) | PU(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PN(u[0], 0, 10) | PN(u[1], 10, 10) | PN(u[2], 20, 10) | PN(u[3], 30, 2);
			break;
		}

		case TextureFormat::SNORM_INT_1010102_REV:
		{
			const Vec4 u = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PS(u[0], 0, 10) | PS(u[1], 10, 10) | PS(u[2], 20, 10) | PS(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_1010102_REV:
		{
			const UVec4 u = swizzleRB(color.cast<deUint32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PU(u[0], 0, 10) | PU(u[1], 10, 10) | PU(u[2], 20, 10) | PU(u[3], 30, 2);
			break;
		}

		case TextureFormat::SIGNED_INT_1010102_REV:
		{
			const IVec4 u = swizzleRB(color.cast<deInt32>(), TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PI(u[0], 0, 10) | PI(u[1], 10, 10) | PI(u[2], 20, 10) | PI(u[3], 30, 2);
			break;
		}

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			*((deUint32*)pixelPtr) = Float11(color[0]).bits() | (Float11(color[1]).bits() << 11) | (Float10(color[2]).bits() << 22);
			break;

		case TextureFormat::UNSIGNED_INT_999_E5_REV:
			*((deUint32*)pixelPtr) = packRGB999E5(color);
			break;

		default:
		{
			// Generic path.
			int								numChannels	= getNumUsedChannels(m_format.order);
			const TextureSwizzle::Channel*	map			= getChannelWriteSwizzle(m_format.order).components;
			int								channelSize	= getChannelSize(m_format.type);

			for (int c = 0; c < numChannels; c++)
			{
				DE_ASSERT(deInRange32(map[c], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3));
				floatToChannel(pixelPtr + channelSize*c, color[map[c]], m_format.type);
			}
			break;
		}
	}

#undef PN
#undef PS
#undef PU
#undef PI
}